

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::PatternMatcher::PatternMatcher
          (PatternMatcher *this,string *designation,Module *module,Split *list)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  ostream *o;
  mapped_type *pmVar3;
  long lVar4;
  Function *pFVar5;
  ostream *poVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  pointer pbVar8;
  string_view sVar9;
  Name name;
  Name name_00;
  string_view s;
  string_view local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [23];
  pointer local_80;
  Module *local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_70;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_68;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *local_60;
  string *local_58;
  PatternMatcher *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  char local_31;
  
  local_48 = &(this->designation).field_2;
  (this->designation)._M_dataplus._M_p = (pointer)local_48;
  pcVar2 = (designation->_M_dataplus)._M_p;
  local_78 = module;
  local_58 = designation;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + designation->_M_string_length);
  p_Var1 = &(this->names)._M_t._M_impl.super__Rb_tree_header;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->patterns)._M_t._M_impl.super__Rb_tree_header;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->patternsMatched)._M_t._M_impl.super__Rb_tree_header;
  (this->patternsMatched)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->patternsMatched)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->patternsMatched)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->patternsMatched)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->patternsMatched)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->unescaped)._M_t._M_impl.super__Rb_tree_header;
  (this->unescaped)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unescaped)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->unescaped)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->unescaped)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->unescaped)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar8 = (list->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (list->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != local_80) {
    local_60 = &this->names;
    local_68 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->patterns;
    psVar7 = &this->patternsMatched;
    local_70 = &this->unescaped;
    local_50 = this;
    local_40 = psVar7;
    do {
      sVar9._M_str = (char *)0x0;
      sVar9._M_len = (size_t)(pbVar8->_M_dataplus)._M_p;
      sVar9 = IString::interned((IString *)pbVar8->_M_string_length,sVar9,SUB81(psVar7,0));
      name = WasmBinaryReader::escape((Name)sVar9);
      name_00.super_IString.str._M_len = name.super_IString.str._M_str;
      o = name.super_IString.str._M_len;
      local_208._M_len = (size_t)local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,name_00.super_IString.str._M_len,
                 name_00.super_IString.str._M_len + (long)o);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,(key_type *)&local_208);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_len != local_1f8) {
        operator_delete((void *)local_208._M_len,local_1f8[0]._M_allocated_capacity + 1);
      }
      lVar4 = std::__cxx11::string::find((char)pbVar8,0x2a);
      if (lVar4 == -1) {
        pFVar5 = Module::getFunctionOrNull(local_78,name);
        if (pFVar5 == (Function *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"warning: Asyncify ",0x12);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(local_58->_M_dataplus)._M_p,
                              local_58->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"list contained a non-existing function name: ",0x2d);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
          name_00.super_IString.str._M_str = (char *)psVar7;
          poVar6 = wasm::operator<<((wasm *)poVar6,o,name_00);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
        }
        else if ((pFVar5->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
          Fatal::Fatal((Fatal *)&local_208);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1f8[0]._M_local_buf,"Asyncify ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1f8[0]._M_local_buf,(local_58->_M_dataplus)._M_p,
                     local_58->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1f8[0]._M_local_buf,
                     "list contained an imported function name (use the import list for imports): ",
                     0x4c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1f8[0]._M_local_buf,(pbVar8->_M_dataplus)._M_p,
                     pbVar8->_M_string_length);
          local_31 = '\n';
          Fatal::operator<<((Fatal *)&local_208,&local_31);
          Fatal::~Fatal((Fatal *)&local_208);
        }
        s._M_str = (char *)0x0;
        s._M_len = (size_t)name_00.super_IString.str._M_len;
        local_208 = IString::interned((IString *)o,s,SUB81(psVar7,0));
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::_M_insert_unique<wasm::Name>(&local_60->_M_t,(Name *)&local_208);
      }
      else {
        local_208._M_len = (size_t)local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,name_00.super_IString.str._M_len,
                   name_00.super_IString.str._M_len + (long)o);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>(local_68,(key_type *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_len != local_1f8) {
          operator_delete((void *)local_208._M_len,local_1f8[0]._M_allocated_capacity + 1);
        }
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_80);
  }
  return;
}

Assistant:

PatternMatcher(std::string designation,
                 Module& module,
                 const String::Split& list)
    : designation(designation) {
    // The lists contain human-readable strings. Turn them into the
    // internal escaped names for later comparisons
    for (auto& name : list) {
      auto escaped = WasmBinaryReader::escape(name);
      unescaped[escaped.toString()] = name;
      if (name.find('*') != std::string::npos) {
        patterns.insert(escaped.toString());
      } else {
        auto* func = module.getFunctionOrNull(escaped);
        if (!func) {
          std::cerr << "warning: Asyncify " << designation
                    << "list contained a non-existing function name: " << name
                    << " (" << escaped << ")\n";
        } else if (func->imported()) {
          Fatal() << "Asyncify " << designation
                  << "list contained an imported function name (use the import "
                     "list for imports): "
                  << name << '\n';
        }
        names.insert(escaped.str);
      }
    }
  }